

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::~UnknownFieldSet(UnknownFieldSet *this)

{
  UnknownFieldSet *this_local;
  
  Clear(this);
  RepeatedField<google::protobuf::UnknownField>::~RepeatedField(&this->fields_);
  return;
}

Assistant:

inline UnknownFieldSet::~UnknownFieldSet() { Clear(); }